

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void check_for_missing<ImputedData<long,long_double>,InputData<float,long>>
               (InputData<float,_long> *input_data,
               vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
               *impute_vec,
               robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *impute_map,int nthreads)

{
  vector<char,_std::allocator<char>_> *this;
  pointer pcVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  uint *puVar8;
  int *piVar9;
  value_type_conflict5 local_29;
  
  this = &input_data->has_missing;
  local_29 = '\0';
  std::vector<char,_std::allocator<char>_>::_M_fill_assign(this,input_data->nrows,&local_29);
  if ((input_data->Xc_indptr != (long *)0x0) && (input_data->ncols_numeric != 0)) {
    uVar4 = 0;
    do {
      uVar7 = input_data->Xc_indptr[uVar4];
      uVar5 = uVar4 + 1;
      if (uVar7 < (ulong)input_data->Xc_indptr[uVar4 + 1]) {
        do {
          if (0x7f7fffff < (uint)ABS(input_data->Xc[uVar7])) {
            (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[input_data->Xc_ind[uVar7]] = '\x01';
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)input_data->Xc_indptr[uVar5]);
      }
      uVar4 = uVar5;
    } while (uVar5 < input_data->ncols_numeric);
  }
  if ((input_data->categ_data != (int *)0x0 || input_data->numeric_data != (float *)0x0) &&
     (uVar4 = input_data->nrows, uVar4 != 0)) {
    lVar2 = 0;
    uVar7 = 0;
    do {
      if ((input_data->Xc_indptr == (long *)0x0) && (sVar3 = input_data->ncols_numeric, sVar3 != 0))
      {
        puVar8 = (uint *)((long)input_data->numeric_data + lVar2);
        do {
          if (0x7f7fffff < (*puVar8 & 0x7fffffff)) {
            (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar7] = '\x01';
            break;
          }
          puVar8 = puVar8 + uVar4;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      pcVar1 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((pcVar1[uVar7] == '\0') && (sVar3 = input_data->ncols_categ, sVar3 != 0)) {
        piVar9 = (int *)((long)input_data->categ_data + lVar2);
        do {
          if (*piVar9 < 0) {
            pcVar1[uVar7] = '\x01';
            break;
          }
          piVar9 = piVar9 + input_data->nrows;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      uVar7 = uVar7 + 1;
      uVar4 = input_data->nrows;
      lVar2 = lVar2 + 4;
    } while (uVar7 < uVar4);
  }
  sVar3 = 0;
  for (pcVar6 = (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar6 != (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish; pcVar6 = pcVar6 + 1) {
    sVar3 = sVar3 + (long)*pcVar6;
  }
  input_data->n_missing = sVar3;
  allocate_imp<ImputedData<long,long_double>,InputData<float,long>>
            (input_data,impute_vec,impute_map,nthreads);
  return;
}

Assistant:

void check_for_missing(InputData &input_data,
                       std::vector<ImputedData> &impute_vec,
                       hashed_map<size_t, ImputedData> &impute_map,
                       int nthreads)
{
    input_data.has_missing.assign(input_data.nrows, false);

    if (input_data.Xc_indptr != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(col, input_data)
            for (size_t_for ix = input_data.Xc_indptr[col]; ix < (decltype(ix))input_data.Xc_indptr[col + 1]; ix++)
                if (is_na_or_inf(input_data.Xc[ix]))
                    input_data.has_missing[input_data.Xc_ind[ix]] = true;
            #pragma omp barrier
    }

    if (input_data.numeric_data != NULL || input_data.categ_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) shared(input_data)
        for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
        {
            if (input_data.Xc_indptr == NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                    {
                        input_data.has_missing[row] = true;
                        break;
                    }
                }
            }

            if (!input_data.has_missing[row])
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    if (input_data.categ_data[row + col * input_data.nrows] < 0)
                    {
                        input_data.has_missing[row] = true;
                        break;
                    }
                }
        }
    }

    input_data.n_missing = std::accumulate(input_data.has_missing.begin(), input_data.has_missing.end(), (size_t)0);
    allocate_imp(input_data, impute_vec, impute_map, nthreads);
}